

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O1

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,undefined4 param_2)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  
  switch(param_2) {
  case 0:
    cVar2 = 'b';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "IiF7bs"[lVar3 + 5];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 1:
    cVar2 = 'b';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "pdbbc"[lVar3 + 4];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 2:
    cVar2 = 'l';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "pdbls"[lVar3 + 4];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 3:
    cVar2 = 'l';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "pdblc"[lVar3 + 4];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 4:
    cVar2 = 's';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fdabss"[lVar3 + 5];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 5:
    cVar2 = 's';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "pdbsc"[lVar3 + 4];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 6:
    cVar2 = 'a';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "_Las"[lVar3 + 3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 7:
    cVar2 = 'a';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "pdbac"[lVar3 + 4];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 8:
    cVar2 = 'w';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "IiF7ws"[lVar3 + 5];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 9:
    cVar2 = 'w';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "pdbwc"[lVar3 + 4];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 10:
    cVar2 = 'i';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "pdbis"[lVar3 + 4];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 0xb:
    cVar2 = 'i';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "pdbic"[lVar3 + 4];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 0xc:
    cVar2 = 'g';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "pdbgs"[lVar3 + 4];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 0xd:
    cVar2 = 'g';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "pdbgc"[lVar3 + 4];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 0xe:
    cVar2 = 'c';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "pdbcs"[lVar3 + 4];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  case 0xf:
    cVar2 = 'c';
    lVar3 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "acc"[lVar3 + 2];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    break;
  default:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = '?';
    return this;
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Pcc pcc)
{
    switch (pcc.raw) {

        case 0:  *this << "bs"; break;
        case 1:  *this << "bc"; break;
        case 2:  *this << "ls"; break;
        case 3:  *this << "lc"; break;
        case 4:  *this << "ss"; break;
        case 5:  *this << "sc"; break;
        case 6:  *this << "as"; break;
        case 7:  *this << "ac"; break;
        case 8:  *this << "ws"; break;
        case 9:  *this << "wc"; break;
        case 10: *this << "is"; break;
        case 11: *this << "ic"; break;
        case 12: *this << "gs"; break;
        case 13: *this << "gc"; break;
        case 14: *this << "cs"; break;
        case 15: *this << "cc"; break;

        default:
            *this << "?";
    }
    return *this;
}